

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O3

EVP_PKEY * crypto_read_file(char *filePath,char *filePIN)

{
  BIO *bp;
  X509_SIG *p8;
  size_t sVar1;
  PKCS8_PRIV_KEY_INFO *p8_00;
  EVP_PKEY *pEVar2;
  
  bp = BIO_new_file(filePath,"rb");
  if (bp == (BIO *)0x0) {
    fprintf(_stderr,"ERROR: Could open the PKCS#8 file: %s\n",filePath);
    return (EVP_PKEY *)0x0;
  }
  if (filePIN == (char *)0x0) {
    p8_00 = PEM_read_bio_PKCS8_PRIV_KEY_INFO
                      (bp,(PKCS8_PRIV_KEY_INFO **)0x0,(undefined1 *)0x0,(void *)0x0);
    BIO_free(bp);
    if (p8_00 == (PKCS8_PRIV_KEY_INFO *)0x0) {
      crypto_read_file();
      return (EVP_PKEY *)0x0;
    }
  }
  else {
    p8 = PEM_read_bio_PKCS8(bp,(X509_SIG **)0x0,(undefined1 *)0x0,(void *)0x0);
    BIO_free(bp);
    if (p8 == (X509_SIG *)0x0) {
      crypto_read_file();
      return (EVP_PKEY *)0x0;
    }
    sVar1 = strlen(filePIN);
    p8_00 = PKCS8_decrypt(p8,filePIN,(int)sVar1);
    X509_SIG_free(p8);
    if (p8_00 == (PKCS8_PRIV_KEY_INFO *)0x0) {
      crypto_read_file();
      return (EVP_PKEY *)0x0;
    }
  }
  pEVar2 = EVP_PKCS82PKEY(p8_00);
  PKCS8_PRIV_KEY_INFO_free(p8_00);
  if (pEVar2 == (EVP_PKEY *)0x0) {
    crypto_read_file();
    return (EVP_PKEY *)0x0;
  }
  return (EVP_PKEY *)pEVar2;
}

Assistant:

EVP_PKEY* crypto_read_file(char* filePath, char* filePIN)
{
	BIO* in = NULL;
	PKCS8_PRIV_KEY_INFO* p8inf = NULL;
	EVP_PKEY* pkey = NULL;
	X509_SIG* p8 = NULL;

	if (!(in = BIO_new_file(filePath, "rb")))
	{
		fprintf(stderr, "ERROR: Could open the PKCS#8 file: %s\n", filePath);
		return NULL;
	}

	// The PKCS#8 file is encrypted
	if (filePIN)
	{
		p8 = PEM_read_bio_PKCS8(in, NULL, NULL, NULL);
		BIO_free(in);

		if (!p8)
		{
			fprintf(stderr, "ERROR: Could not read the PKCS#8 file. "
					"Maybe the file is not encrypted.\n");
			return NULL;
		}

		p8inf = PKCS8_decrypt(p8, filePIN, strlen(filePIN));
		X509_SIG_free(p8);

		if (!p8inf)
		{
			fprintf(stderr, "ERROR: Could not decrypt the PKCS#8 file. "
					"Maybe wrong PIN to file (--file-pin <PIN>)\n");
			return NULL;
		}
	}
	else
	{
		p8inf = PEM_read_bio_PKCS8_PRIV_KEY_INFO(in, NULL, NULL, NULL);
		BIO_free(in);

		if (!p8inf)
		{
			fprintf(stderr, "ERROR: Could not read the PKCS#8 file. "
					"Maybe it is encypted (--file-pin <PIN>)\n");
			return NULL;
		}
	}

	// Convert the PKCS#8 to OpenSSL
	pkey = EVP_PKCS82PKEY(p8inf);
	PKCS8_PRIV_KEY_INFO_free(p8inf);
	if (!pkey)
	{
		fprintf(stderr, "ERROR: Could not convert the key.\n");
		return NULL;
	}

	return pkey;
}